

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_constructor.h
# Opt level: O1

duk_ret_t dukglue::detail::call_native_deleter<Shape>(duk_context *ctx)

{
  duk_bool_t dVar1;
  long *obj_ptr;
  
  duk_push_this(ctx);
  duk_get_prop_string(ctx,-1,anon_var_dwarf_ce87);
  dVar1 = duk_is_pointer(ctx,-1);
  if (dVar1 != 0) {
    obj_ptr = (long *)duk_require_pointer(ctx,-1);
    RefManager::find_and_invalidate_native_object(ctx,obj_ptr);
    if (obj_ptr != (long *)0x0) {
      (**(code **)(*obj_ptr + 8))(obj_ptr);
    }
    duk_pop_2(ctx);
    return 0;
  }
  duk_error_raw(ctx,-4,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_constructor.h"
                ,0x3d,"Object has already been invalidated; cannot delete.");
}

Assistant:

static duk_ret_t call_native_deleter(duk_context* ctx)
	{
		duk_push_this(ctx);
		duk_get_prop_string(ctx, -1, "\xFF" "obj_ptr");

		if (!duk_is_pointer(ctx, -1)) {
			duk_error(ctx, DUK_RET_REFERENCE_ERROR, "Object has already been invalidated; cannot delete.");
			return DUK_RET_REFERENCE_ERROR;
		}

		Cls* obj = static_cast<Cls*>(duk_require_pointer(ctx, -1));
		dukglue_invalidate_object(ctx, obj);
		delete obj;

		duk_pop_2(ctx);
		return 0;
	}